

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-posix.c
# Opt level: O0

int mi_wdupenv_s(unsigned_short **buf,size_t *size,unsigned_short *name)

{
  unsigned_short *name_local;
  size_t *size_local;
  unsigned_short **buf_local;
  
  if ((buf != (unsigned_short **)0x0) && (name != (unsigned_short *)0x0)) {
    if (size != (size_t *)0x0) {
      *size = 0;
    }
    *buf = (unsigned_short *)0x0;
  }
  return 0x16;
}

Assistant:

int mi_wdupenv_s(unsigned short** buf, size_t* size, const unsigned short* name) mi_attr_noexcept {
  if (buf==NULL || name==NULL) return EINVAL;
  if (size != NULL) *size = 0;
#if !defined(_WIN32) || (defined(WINAPI_FAMILY) && (WINAPI_FAMILY != WINAPI_FAMILY_DESKTOP_APP))
  // not supported
  *buf = NULL;
  return EINVAL;
#else
  unsigned short* p = (unsigned short*)_wgetenv((const wchar_t*)name);  // msvc warning 4996
  if (p==NULL) {
    *buf = NULL;
  }
  else {
    *buf = mi_wcsdup(p);
    if (*buf==NULL) return ENOMEM;
    if (size != NULL) *size = wcslen((const wchar_t*)p);
  }
  return 0;
#endif
}